

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

ProceduralBlockSymbol *
slang::ast::ProceduralBlockSymbol::createProceduralBlock
          (Scope *scope,ProceduralBlockKind kind,SourceLocation location,MemberSyntax *syntax,
          StatementSyntax *stmtSyntax,
          span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>
          *additionalBlocks)

{
  size_type sVar1;
  ProceduralBlockSymbol *this;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar2;
  ProceduralBlockKind local_34;
  SourceLocation local_30;
  
  local_34 = kind;
  local_30 = location;
  this = BumpAllocator::
         emplace<slang::ast::ProceduralBlockSymbol,slang::SourceLocation&,slang::ast::ProceduralBlockKind&>
                   (&scope->compilation->super_BumpAllocator,&local_30,&local_34);
  (this->super_Symbol).originatingSyntax = &syntax->super_SyntaxNode;
  syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)&syntax->attributes);
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
  sVar2 = Statement::createBlockItems(scope,stmtSyntax,false);
  this->blocks = sVar2;
  this->stmtSyntax = stmtSyntax;
  sVar1 = (this->blocks).size_;
  additionalBlocks->data_ = (this->blocks).data_;
  additionalBlocks->size_ = sVar1;
  return this;
}

Assistant:

ProceduralBlockSymbol& ProceduralBlockSymbol::createProceduralBlock(
    const Scope& scope, ProceduralBlockKind kind, SourceLocation location,
    const MemberSyntax& syntax, const StatementSyntax& stmtSyntax,
    span<const StatementBlockSymbol* const>& additionalBlocks) {

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ProceduralBlockSymbol>(location, kind);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->blocks = Statement::createBlockItems(scope, stmtSyntax, /* labelHandled */ false);
    result->stmtSyntax = &stmtSyntax;

    additionalBlocks = result->blocks;

    return *result;
}